

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

void xmlSchematronFree(xmlSchematronPtr schema)

{
  xmlSchematronRulePtr pxVar1;
  xmlSchematronTestPtr pxVar2;
  xmlSchematronLetPtr pxVar3;
  xmlSchematronPatternPtr pxVar4;
  xmlSchematronRulePtr_conflict pxVar5;
  xmlSchematronPatternPtr_conflict pxVar6;
  xmlSchematronTestPtr_conflict pxVar7;
  xmlSchematronLetPtr_conflict pxVar8;
  
  if (schema != (xmlSchematronPtr)0x0) {
    if ((schema->doc != (xmlDocPtr)0x0) && (schema->preserve == 0)) {
      xmlFreeDoc(schema->doc);
    }
    if (schema->namespaces != (xmlChar **)0x0) {
      (*xmlFree)(schema->namespaces);
    }
    pxVar5 = schema->rules;
    while (pxVar5 != (xmlSchematronRulePtr_conflict)0x0) {
      pxVar1 = pxVar5->next;
      pxVar7 = pxVar5->tests;
      if (pxVar5->tests != (xmlSchematronTestPtr_conflict)0x0) {
        while (pxVar7 != (xmlSchematronTestPtr_conflict)0x0) {
          pxVar2 = pxVar7->next;
          if (pxVar7->test != (xmlChar *)0x0) {
            (*xmlFree)(pxVar7->test);
          }
          if (pxVar7->comp != (xmlXPathCompExprPtr)0x0) {
            xmlXPathFreeCompExpr(pxVar7->comp);
          }
          if (pxVar7->report != (xmlChar *)0x0) {
            (*xmlFree)(pxVar7->report);
          }
          (*xmlFree)(pxVar7);
          pxVar7 = pxVar2;
        }
      }
      if (pxVar5->context != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->context);
      }
      if (pxVar5->pattern != (xmlPatternPtr)0x0) {
        xmlFreePattern(pxVar5->pattern);
      }
      if (pxVar5->report != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->report);
      }
      pxVar8 = pxVar5->lets;
      if (pxVar5->lets != (xmlSchematronLetPtr_conflict)0x0) {
        while (pxVar8 != (xmlSchematronLetPtr_conflict)0x0) {
          pxVar3 = pxVar8->next;
          if (pxVar8->name != (xmlChar *)0x0) {
            (*xmlFree)(pxVar8->name);
          }
          if (pxVar8->comp != (xmlXPathCompExprPtr)0x0) {
            xmlXPathFreeCompExpr(pxVar8->comp);
          }
          (*xmlFree)(pxVar8);
          pxVar8 = pxVar3;
        }
      }
      (*xmlFree)(pxVar5);
      pxVar5 = pxVar1;
    }
    pxVar6 = schema->patterns;
    while (pxVar6 != (xmlSchematronPatternPtr_conflict)0x0) {
      pxVar4 = pxVar6->next;
      if (pxVar6->name != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6->name);
      }
      (*xmlFree)(pxVar6);
      pxVar6 = pxVar4;
    }
    xmlDictFree(schema->dict);
    (*xmlFree)(schema);
    return;
  }
  return;
}

Assistant:

void
xmlSchematronFree(xmlSchematronPtr schema)
{
    if (schema == NULL)
        return;

    if ((schema->doc != NULL) && (!(schema->preserve)))
        xmlFreeDoc(schema->doc);

    if (schema->namespaces != NULL)
        xmlFree((char **) schema->namespaces);

    xmlSchematronFreeRules(schema->rules);
    xmlSchematronFreePatterns(schema->patterns);
    xmlDictFree(schema->dict);
    xmlFree(schema);
}